

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ons_test.cc
# Opt level: O0

int test_ons_trend_get_machine_sar(void)

{
  code *pcVar1;
  char *__s;
  Ons *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_2a1;
  int ret;
  HttpTestListener *local_280;
  HttpTestListener *listener;
  string local_270;
  allocator<char> local_249;
  string local_248 [39];
  allocator<char> local_221;
  string local_220 [55];
  allocator<char> local_1e9;
  string local_1e8 [32];
  Ons *local_1c8;
  Ons *ons;
  OnsOnsTrendGetMachineSarResponseType resp;
  OnsOnsTrendGetMachineSarRequestType req;
  
  aliyun::OnsOnsTrendGetMachineSarRequestType::OnsOnsTrendGetMachineSarRequestType
            ((OnsOnsTrendGetMachineSarRequestType *)((long)&resp.help_url.field_2 + 8));
  aliyun::OnsOnsTrendGetMachineSarResponseType::OnsOnsTrendGetMachineSarResponseType
            ((OnsOnsTrendGetMachineSarResponseType *)&ons);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"cn-hangzhou",&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_220,"my_appid",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_248,"my_secret",&local_249);
  pOVar2 = (Ons *)aliyun::Ons::CreateOnsClient(local_1e8,local_220,local_248);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  local_1c8 = pOVar2;
  if (pOVar2 == (Ons *)0x0) {
    aliyun::OnsOnsTrendGetMachineSarResponseType::~OnsOnsTrendGetMachineSarResponseType
              ((OnsOnsTrendGetMachineSarResponseType *)&ons);
    aliyun::OnsOnsTrendGetMachineSarRequestType::~OnsOnsTrendGetMachineSarRequestType
              ((OnsOnsTrendGetMachineSarRequestType *)((long)&resp.help_url.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Ons::SetProxyHost(pOVar2,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Ons::SetUseTls(local_1c8,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_ons_trend_get_machine_sar_response;
  local_280 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_2a1);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_2a1);
  HttpTestListener::Start(local_280);
  std::__cxx11::string::operator=((string *)(resp.help_url.field_2._M_local_buf + 8),"OnsRegionId");
  std::__cxx11::string::operator=
            ((string *)(req.ons_region_id.field_2._M_local_buf + 8),"OnsPlatform");
  std::__cxx11::string::operator=
            ((string *)(req.ons_platform.field_2._M_local_buf + 8),"PreventCache");
  std::__cxx11::string::operator=((string *)(req.prevent_cache.field_2._M_local_buf + 8),"HostIp");
  std::__cxx11::string::operator=((string *)(req.host_ip.field_2._M_local_buf + 8),"AppId");
  std::__cxx11::string::operator=((string *)(req.app_id.field_2._M_local_buf + 8),"Metric");
  std::__cxx11::string::operator=((string *)(req.metric.field_2._M_local_buf + 8),"BeginTime");
  std::__cxx11::string::operator=((string *)(req.begin_time.field_2._M_local_buf + 8),"EndTime");
  std::__cxx11::string::operator=((string *)(req.end_time.field_2._M_local_buf + 8),"Period");
  aliyun::Ons::OnsTrendGetMachineSar
            (local_1c8,(OnsOnsTrendGetMachineSarRequestType *)((long)&resp.help_url.field_2 + 8),
             (OnsOnsTrendGetMachineSarResponseType *)&ons,(OnsErrorInfo *)0x0);
  HttpTestListener::WaitComplete(local_280);
  pHVar3 = local_280;
  if (local_280 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_280);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_1c8;
  if (local_1c8 != (Ons *)0x0) {
    aliyun::Ons::~Ons(local_1c8);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_ons_trend_get_machine_sar() {
  OnsOnsTrendGetMachineSarRequestType req;
  OnsOnsTrendGetMachineSarResponseType resp;
  Ons* ons = Ons::CreateOnsClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ons) return 0;
  ons->SetProxyHost("127.0.0.1:12234");
  ons->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_ons_trend_get_machine_sar_response);
  listener->Start();
  req.ons_region_id = "OnsRegionId";
  req.ons_platform = "OnsPlatform";
  req.prevent_cache = "PreventCache";
  req.host_ip = "HostIp";
  req.app_id = "AppId";
  req.metric = "Metric";
  req.begin_time = "BeginTime";
  req.end_time = "EndTime";
  req.period = "Period";
  int ret = ons->OnsTrendGetMachineSar(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ons;
}